

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int llex(LexState *ls,SemInfo *seminfo)

{
  size_t sVar1;
  byte *pbVar2;
  int iVar3;
  ushort **ppuVar4;
  TString *pTVar5;
  bool bVar6;
  uint local_7c;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_40;
  uint local_3c;
  int c;
  TString *ts;
  int sep_1;
  int sep;
  SemInfo *seminfo_local;
  LexState *ls_local;
  
  ls->buff->n = 0;
LAB_001110e3:
  while( true ) {
    while( true ) {
      iVar3 = ls->current;
      if (iVar3 == -1) {
        return 0x11f;
      }
      if ((iVar3 != 10) && (iVar3 != 0xd)) break;
      inclinenumber(ls);
    }
    if ((iVar3 == 0x22) || (iVar3 == 0x27)) {
      read_string(ls,ls->current,seminfo);
      return 0x11e;
    }
    if (iVar3 == 0x2d) break;
    if (iVar3 == 0x2e) {
      save(ls,ls->current);
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_6c = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_6c = (uint)*pbVar2;
      }
      ls->current = local_6c;
      iVar3 = check_next(ls,".");
      if (iVar3 != 0) {
        iVar3 = check_next(ls,".");
        if (iVar3 != 0) {
          return 0x117;
        }
        return 0x116;
      }
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[ls->current] & 0x800) == 0) {
        return 0x2e;
      }
      read_numeral(ls,seminfo);
      return 0x11c;
    }
    if (iVar3 == 0x3c) {
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_54 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_54 = (uint)*pbVar2;
      }
      ls->current = local_54;
      if (ls->current != 0x3d) {
        return 0x3c;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_58 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_58 = (uint)*pbVar2;
      }
      ls->current = local_58;
      return 0x11a;
    }
    if (iVar3 == 0x3d) {
LAB_00111391:
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_4c = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_4c = (uint)*pbVar2;
      }
      ls->current = local_4c;
      if (ls->current != 0x3d) {
        return 0x3d;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_50 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_50 = (uint)*pbVar2;
      }
      ls->current = local_50;
      return 0x118;
    }
    if (iVar3 == 0x3e) {
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_5c = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_5c = (uint)*pbVar2;
      }
      ls->current = local_5c;
      if (ls->current != 0x3d) {
        return 0x3e;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_60 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_60 = (uint)*pbVar2;
      }
      ls->current = local_60;
      return 0x119;
    }
    if (iVar3 == 0x5b) {
      iVar3 = skip_sep(ls);
      if (-1 < iVar3) {
        read_long_string(ls,seminfo,iVar3);
        return 0x11e;
      }
      if (iVar3 == -1) {
        return 0x5b;
      }
      luaX_lexerror(ls,"invalid long string delimiter",0x11e);
      goto LAB_00111391;
    }
    if (iVar3 == 0x7e) {
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_64 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_64 = (uint)*pbVar2;
      }
      ls->current = local_64;
      if (ls->current != 0x3d) {
        return 0x7e;
      }
      sVar1 = ls->z->n;
      ls->z->n = sVar1 - 1;
      if (sVar1 == 0) {
        local_68 = luaZ_fill(ls->z);
      }
      else {
        pbVar2 = (byte *)ls->z->p;
        ls->z->p = (char *)(pbVar2 + 1);
        local_68 = (uint)*pbVar2;
      }
      ls->current = local_68;
      return 0x11b;
    }
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[ls->current] & 0x2000) == 0) {
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[ls->current] & 0x800) != 0) {
        read_numeral(ls,seminfo);
        return 0x11c;
      }
      ppuVar4 = __ctype_b_loc();
      if ((((*ppuVar4)[ls->current] & 0x400) == 0) && (ls->current != 0x5f)) {
        iVar3 = ls->current;
        sVar1 = ls->z->n;
        ls->z->n = sVar1 - 1;
        if (sVar1 == 0) {
          local_7c = luaZ_fill(ls->z);
        }
        else {
          pbVar2 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar2 + 1);
          local_7c = (uint)*pbVar2;
        }
        ls->current = local_7c;
        return iVar3;
      }
      do {
        save(ls,ls->current);
        sVar1 = ls->z->n;
        ls->z->n = sVar1 - 1;
        if (sVar1 == 0) {
          local_74 = luaZ_fill(ls->z);
        }
        else {
          pbVar2 = (byte *)ls->z->p;
          ls->z->p = (char *)(pbVar2 + 1);
          local_74 = (uint)*pbVar2;
        }
        ls->current = local_74;
        ppuVar4 = __ctype_b_loc();
        bVar6 = true;
        if (((*ppuVar4)[ls->current] & 8) == 0) {
          bVar6 = ls->current == 0x5f;
        }
      } while (bVar6);
      pTVar5 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
      if ((pTVar5->tsv).reserved != '\0') {
        return (pTVar5->tsv).reserved + 0x100;
      }
      seminfo->ts = pTVar5;
      return 0x11d;
    }
    sVar1 = ls->z->n;
    ls->z->n = sVar1 - 1;
    if (sVar1 == 0) {
      local_70 = luaZ_fill(ls->z);
    }
    else {
      pbVar2 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar2 + 1);
      local_70 = (uint)*pbVar2;
    }
    ls->current = local_70;
  }
  sVar1 = ls->z->n;
  ls->z->n = sVar1 - 1;
  if (sVar1 == 0) {
    local_3c = luaZ_fill(ls->z);
  }
  else {
    pbVar2 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar2 + 1);
    local_3c = (uint)*pbVar2;
  }
  ls->current = local_3c;
  if (ls->current != 0x2d) {
    return 0x2d;
  }
  sVar1 = ls->z->n;
  ls->z->n = sVar1 - 1;
  if (sVar1 == 0) {
    local_40 = luaZ_fill(ls->z);
  }
  else {
    pbVar2 = (byte *)ls->z->p;
    ls->z->p = (char *)(pbVar2 + 1);
    local_40 = (uint)*pbVar2;
  }
  ls->current = local_40;
  if (ls->current == 0x5b) {
    iVar3 = skip_sep(ls);
    ls->buff->n = 0;
    if (-1 < iVar3) {
      read_long_string(ls,(SemInfo *)0x0,iVar3);
      ls->buff->n = 0;
      goto LAB_001110e3;
    }
  }
  while( true ) {
    bVar6 = false;
    if ((ls->current != 10) && (bVar6 = false, ls->current != 0xd)) {
      bVar6 = ls->current != -1;
    }
    if (!bVar6) break;
    sVar1 = ls->z->n;
    ls->z->n = sVar1 - 1;
    if (sVar1 == 0) {
      local_48 = luaZ_fill(ls->z);
    }
    else {
      pbVar2 = (byte *)ls->z->p;
      ls->z->p = (char *)(pbVar2 + 1);
      local_48 = (uint)*pbVar2;
    }
    ls->current = local_48;
  }
  goto LAB_001110e3;
}

Assistant:

static int llex(LexState*ls,SemInfo*seminfo){
luaZ_resetbuffer(ls->buff);
for(;;){
switch(ls->current){
case'\n':
case'\r':{
inclinenumber(ls);
continue;
}
case'-':{
next(ls);
if(ls->current!='-')return'-';
next(ls);
if(ls->current=='['){
int sep=skip_sep(ls);
luaZ_resetbuffer(ls->buff);
if(sep>=0){
read_long_string(ls,NULL,sep);
luaZ_resetbuffer(ls->buff);
continue;
}
}
while(!currIsNewline(ls)&&ls->current!=(-1))
next(ls);
continue;
}
case'[':{
int sep=skip_sep(ls);
if(sep>=0){
read_long_string(ls,seminfo,sep);
return TK_STRING;
}
else if(sep==-1)return'[';
else luaX_lexerror(ls,"invalid long string delimiter",TK_STRING);
}
case'=':{
next(ls);
if(ls->current!='=')return'=';
else{next(ls);return TK_EQ;}
}
case'<':{
next(ls);
if(ls->current!='=')return'<';
else{next(ls);return TK_LE;}
}
case'>':{
next(ls);
if(ls->current!='=')return'>';
else{next(ls);return TK_GE;}
}
case'~':{
next(ls);
if(ls->current!='=')return'~';
else{next(ls);return TK_NE;}
}
case'"':
case'\'':{
read_string(ls,ls->current,seminfo);
return TK_STRING;
}
case'.':{
save_and_next(ls);
if(check_next(ls,".")){
if(check_next(ls,"."))
return TK_DOTS;
else return TK_CONCAT;
}
else if(!isdigit(ls->current))return'.';
else{
read_numeral(ls,seminfo);
return TK_NUMBER;
}
}
case(-1):{
return TK_EOS;
}
default:{
if(isspace(ls->current)){
next(ls);
continue;
}
else if(isdigit(ls->current)){
read_numeral(ls,seminfo);
return TK_NUMBER;
}
else if(isalpha(ls->current)||ls->current=='_'){
TString*ts;
do{
save_and_next(ls);
}while(isalnum(ls->current)||ls->current=='_');
ts=luaX_newstring(ls,luaZ_buffer(ls->buff),
luaZ_bufflen(ls->buff));
if(ts->tsv.reserved>0)
return ts->tsv.reserved-1+257;
else{
seminfo->ts=ts;
return TK_NAME;
}
}
else{
int c=ls->current;
next(ls);
return c;
}
}
}
}
}